

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall amrex::AmrMesh::ClearDistributionMap(AmrMesh *this,int lev)

{
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  DistributionMapping::DistributionMapping((DistributionMapping *)&local_20);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->dmap).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
              ._M_impl.super__Vector_impl_data._M_start + lev),&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void
AmrMesh::ClearDistributionMap (int lev) noexcept
{
    dmap[lev] = DistributionMapping();
}